

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

longlong mkvparser::Segment::CreateInstance
                   (IMkvReader *pReader,longlong pos,Segment **pSegment,Type type)

{
  int iVar1;
  long lVar2;
  longlong lVar3;
  long lVar4;
  ulong uVar5;
  Segment *pSVar6;
  ulong uVar7;
  ulong uVar8;
  longlong lVar9;
  longlong total;
  long len;
  longlong available;
  ulong local_50;
  long local_48;
  ulong local_40;
  Type local_34;
  
  lVar9 = -1;
  if (-1 < pos && pReader != (IMkvReader *)0x0) {
    *pSegment = (Segment *)0x0;
    iVar1 = (*pReader->_vptr_IMkvReader[1])(pReader,&local_50,&local_40);
    if (iVar1 < 0) {
      lVar9 = (longlong)iVar1;
    }
    else {
      lVar9 = -1;
      if (local_40 <= local_50 && -1 < (long)local_40) {
        local_34 = type;
        while( true ) {
          if ((-1 < (long)local_50) && ((long)local_50 <= pos)) {
            return -2;
          }
          lVar9 = GetUIntLength(pReader,pos,&local_48);
          if (lVar9 != 0) {
            return lVar9;
          }
          lVar2 = local_48 + pos;
          if ((-1 < (long)local_50) && ((long)local_50 < lVar2)) {
            return -2;
          }
          if ((long)local_40 < lVar2) {
            return lVar2;
          }
          lVar9 = ReadID(pReader,pos,&local_48);
          if (lVar9 < 0) {
            return -2;
          }
          lVar2 = local_48 + pos;
          lVar3 = GetUIntLength(pReader,lVar2,&local_48);
          if (lVar3 != 0) {
            return lVar3;
          }
          lVar4 = local_48 + lVar2;
          if ((-1 < (long)local_50) && ((long)local_50 < lVar4)) break;
          if ((long)local_40 < lVar4) {
            return lVar4;
          }
          uVar5 = ReadUInt(pReader,lVar2,&local_48);
          if ((long)uVar5 < 0) {
            return uVar5;
          }
          lVar2 = lVar2 + local_48;
          uVar7 = -1L << ((char)local_48 * '\a' & 0x3fU) ^ uVar5;
          if (lVar9 == 0x18538067) {
            uVar8 = 0xffffffffffffffff;
            if (((uVar7 != 0xffffffffffffffff) && (-1 < (long)local_50)) &&
               ((long)(uVar5 + lVar2) <= (long)local_50)) {
              uVar8 = uVar5;
            }
            pSVar6 = (Segment *)operator_new(0xd0,(nothrow_t *)&std::nothrow);
            if (pSVar6 != (Segment *)0x0) {
              pSVar6->m_pReader = pReader;
              pSVar6->m_element_start = pos;
              pSVar6->m_start = lVar2;
              pSVar6->m_size = uVar8;
              (pSVar6->m_eos).m_pSegment = (Segment *)0x0;
              (pSVar6->m_eos).m_element_start = 0;
              (pSVar6->m_eos).m_index = 0;
              (pSVar6->m_eos).m_pos = 0;
              (pSVar6->m_eos).m_element_size = 0;
              (pSVar6->m_eos).m_timecode = 0;
              (pSVar6->m_eos).m_entries = (BlockEntry **)0x0;
              (pSVar6->m_eos).m_entries_size = 0;
              (pSVar6->m_eos).m_entries_count = 0;
              pSVar6->m_type = local_34;
              pSVar6->m_pos = lVar2;
              pSVar6->m_pUnknownSize = (Cluster *)0x0;
              pSVar6->m_pSeekHead = (SeekHead *)0x0;
              pSVar6->m_pInfo = (SegmentInfo *)0x0;
              pSVar6->m_pTracks = (Tracks *)0x0;
              pSVar6->m_pCues = (Cues *)0x0;
              pSVar6->m_pChapters = (Chapters *)0x0;
              pSVar6->m_pTags = (Tags *)0x0;
              pSVar6->m_clusters = (Cluster **)0x0;
              pSVar6->m_clusterCount = 0;
              pSVar6->m_clusterPreloadCount = 0;
              pSVar6->m_clusterSize = 0;
            }
            *pSegment = pSVar6;
            return -(ulong)(pSVar6 == (Segment *)0x0);
          }
          if (uVar7 == 0xffffffffffffffff) {
            return -2;
          }
          pos = lVar2 + uVar5;
          if ((-1 < (long)local_50) && ((long)local_50 < pos)) {
            return -2;
          }
          if ((long)local_40 < pos) {
            return pos;
          }
        }
        return -2;
      }
    }
  }
  return lVar9;
}

Assistant:

long long Segment::CreateInstance(IMkvReader* pReader, long long pos,
                                  Segment*& pSegment, Type type) {
  if (pReader == NULL || pos < 0)
    return E_PARSE_FAILED;

  pSegment = NULL;

  long long total, available;

  const long status = pReader->Length(&total, &available);

  if (status < 0)  // error
    return status;

  if (available < 0)
    return -1;

  if ((total >= 0) && (available > total))
    return -1;

  // I would assume that in practice this loop would execute
  // exactly once, but we allow for other elements (e.g. Void)
  // to immediately follow the EBML header.  This is fine for
  // the source filter case (since the entire file is available),
  // but in the splitter case over a network we should probably
  // just give up early.  We could for example decide only to
  // execute this loop a maximum of, say, 10 times.
  // TODO:
  // There is an implied "give up early" by only parsing up
  // to the available limit.  We do do that, but only if the
  // total file size is unknown.  We could decide to always
  // use what's available as our limit (irrespective of whether
  // we happen to know the total file length).  This would have
  // as its sense "parse this much of the file before giving up",
  // which a slightly different sense from "try to parse up to
  // 10 EMBL elements before giving up".

  for (;;) {
    if ((total >= 0) && (pos >= total))
      return E_FILE_FORMAT_INVALID;

    // Read ID
    long len;
    long long result = GetUIntLength(pReader, pos, len);

    if (result)  // error, or too few available bytes
      return result;

    if ((total >= 0) && ((pos + len) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    const long long idpos = pos;
    const long long id = ReadID(pReader, pos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID

    // Read Size

    result = GetUIntLength(pReader, pos, len);

    if (result)  // error, or too few available bytes
      return result;

    if ((total >= 0) && ((pos + len) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return size;

    pos += len;  // consume length of size of element

    // Pos now points to start of payload

    // Handle "unknown size" for live streaming of webm files.
    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (id == libwebm::kMkvSegment) {
      if (size == unknown_size)
        size = -1;

      else if (total < 0)
        size = -1;

      else if ((pos + size) > total)
        size = -1;

      pSegment = new (std::nothrow) Segment(pReader, idpos, pos, size, type);
      if (pSegment == NULL)
        return E_PARSE_FAILED;

      return 0;  // success
    }

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;

    if ((total >= 0) && ((pos + size) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + size) > available)
      return pos + size;

    pos += size;  // consume payload
  }
}